

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

void get_alsa_error_text(char *msg,int len,int err)

{
  char *pcVar1;
  size_t sVar2;
  int errlen;
  int err_local;
  int len_local;
  char *msg_local;
  
  pcVar1 = (char *)snd_strerror(err);
  sVar2 = strlen(pcVar1);
  if ((int)sVar2 < len) {
    pcVar1 = (char *)snd_strerror(err);
    strcpy(msg,pcVar1);
  }
  else if (len < 0x15) {
    if (len < 5) {
      *msg = '\0';
    }
    else {
      strcpy(msg,"Alsa");
    }
  }
  else {
    sprintf(msg,"Alsa error %d",(ulong)(uint)err);
  }
  return;
}

Assistant:

static void get_alsa_error_text(char *msg, int len, int err)
{
    int errlen = strlen(snd_strerror(err));
    if (errlen < len) {
        strcpy(msg, snd_strerror(err));
    } else if (len > 20) {
        sprintf(msg, "Alsa error %d", err);
    } else if (len > 4) {
        strcpy(msg, "Alsa");
    } else {
        msg[0] = 0;
    }
}